

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CGL::GLScene::Mesh::Mesh(Mesh *this,PolymeshInfo *polyMesh,Matrix4x4 *transform)

{
  list<CGL::Vertex,_std::allocator<CGL::Vertex>_> *plVar1;
  list<CGL::Edge,_std::allocator<CGL::Edge>_> *plVar2;
  list<CGL::Face,_std::allocator<CGL::Face>_> *plVar3;
  undefined8 *puVar4;
  pointer pPVar5;
  PolymeshInfo *pPVar6;
  BSDF *pBVar7;
  HalfedgeMesh *this_00;
  Polygon *p;
  pointer __x;
  ulong uVar8;
  long lVar9;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> vertices;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  polygons;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> texcoords;
  vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_> local_e0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_c8;
  PolymeshInfo *local_a8;
  Matrix4x4 *local_a0;
  vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_> local_98;
  undefined8 uStack_80;
  anon_union_32_3_e2189aaa_for_Vector4D_0 local_78;
  Vector4D local_58;
  
  (this->super_SceneObject)._vptr_SceneObject = (_func_int **)&PTR_set_draw_styles_002a4ff0;
  (this->super_MeshView)._vptr_MeshView = (_func_int **)&PTR_collapse_selected_edge_002a5098;
  (this->potentialFeature).bCoords.field_0.field_0.x = 0.0;
  (this->potentialFeature).bCoords.field_0.field_0.y = 0.0;
  (this->potentialFeature).bCoords.field_0.field_0.z = 0.0;
  (this->selectedFeature).element = (HalfedgeElement *)0x0;
  (this->selectedFeature).w = 0.0;
  this_00 = &this->mesh;
  (this->potentialFeature).element = (HalfedgeElement *)0x0;
  (this->potentialFeature).w = 0.0;
  (this->hoveredFeature).bCoords.field_0.field_0.x = 0.0;
  (this->hoveredFeature).bCoords.field_0.field_0.y = 0.0;
  (this->hoveredFeature).bCoords.field_0.field_0.z = 0.0;
  (this->hoveredFeature).element = (HalfedgeElement *)0x0;
  (this->hoveredFeature).w = 0.0;
  (this->selectedFeature).bCoords.field_0.field_0.x = 0.0;
  (this->selectedFeature).bCoords.field_0.field_0.y = 0.0;
  (this->selectedFeature).bCoords.field_0.field_0.z = 0.0;
  (this->mesh).halfedges.super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
  (this->mesh).halfedges.super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
  (this->mesh).halfedges.super__List_base<CGL::Halfedge,_std::allocator<CGL::Halfedge>_>._M_impl.
  _M_node._M_size = 0;
  plVar1 = &(this->mesh).vertices;
  (this->mesh).vertices.super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar1;
  (this->mesh).vertices.super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar1;
  (this->mesh).vertices.super__List_base<CGL::Vertex,_std::allocator<CGL::Vertex>_>._M_impl._M_node.
  _M_size = 0;
  plVar2 = &(this->mesh).edges;
  (this->mesh).edges.super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->mesh).edges.super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->mesh).edges.super__List_base<CGL::Edge,_std::allocator<CGL::Edge>_>._M_impl._M_node._M_size
       = 0;
  plVar3 = &(this->mesh).faces;
  (this->mesh).faces.super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar3;
  (this->mesh).faces.super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar3;
  (this->mesh).faces.super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node._M_size
       = 0;
  plVar3 = &(this->mesh).boundaries;
  (this->mesh).boundaries.super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)plVar3;
  (this->mesh).boundaries.super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)plVar3;
  (this->mesh).boundaries.super__List_base<CGL::Face,_std::allocator<CGL::Face>_>._M_impl._M_node.
  _M_size = 0;
  local_c8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __x = (polyMesh->polygons).
        super__Vector_base<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>._M_impl.
        super__Vector_impl_data._M_start;
  pPVar5 = (polyMesh->polygons).
           super__Vector_base<CGL::Collada::Polygon,_std::allocator<CGL::Collada::Polygon>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_a0 = transform;
  if (__x != pPVar5) {
    do {
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(&local_c8,&__x->vertex_indices);
      __x = __x + 1;
    } while (__x != pPVar5);
  }
  local_a8 = polyMesh;
  std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::vector(&local_e0,&polyMesh->vertices);
  if (local_e0.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_e0.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      local_78.field_0.x =
           *(double *)
            ((long)&(local_e0.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                     _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar9);
      local_78.field_0.y =
           *(double *)
            ((long)&(local_e0.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                     _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar9 + 8);
      local_78.field_0.z =
           *(double *)
            ((long)&(local_e0.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                     _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar9 + 0x10);
      local_78.field_0.w = 1.0;
      Matrix4x4::operator*(local_a0,(Vector4D *)&local_78.field_0);
      Vector4D::projectTo3D(&local_58);
      puVar4 = (undefined8 *)
               ((long)&(local_e0.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                        _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar9);
      *puVar4 = local_98.super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar4[1] = local_98.super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      puVar4[2] = local_98.super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage;
      puVar4[3] = uStack_80;
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x20;
    } while (uVar8 < (ulong)((long)local_e0.
                                   super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_e0.
                                   super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  pPVar6 = local_a8;
  std::vector<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>::vector(&local_98,&local_a8->texcoords)
  ;
  HalfedgeMesh::build(this_00,&local_c8,&local_e0,&local_98);
  if (pPVar6->material == (MaterialInfo *)0x0) {
    pBVar7 = (BSDF *)operator_new(0x50);
    pBVar7->_vptr_BSDF = (_func_int **)std::__detail::_Prime_rehash_policy::_M_need_rehash;
    pBVar7[1].reflectanceMap = (HDRImageBuffer *)0x3fe0000000000000;
    pBVar7[1].normalMap = (HDRImageBuffer *)0x3fe0000000000000;
    pBVar7[2]._vptr_BSDF = (_func_int **)0x3fe0000000000000;
    pBVar7[2].normalMap = (HDRImageBuffer *)&PTR__Sampler3D_002a5428;
  }
  else {
    pBVar7 = pPVar6->material->bsdf;
  }
  this->bsdf = pBVar7;
  if (local_98.super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<CGL::Vector2D,_std::allocator<CGL::Vector2D>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e0.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

Mesh::Mesh(Collada::PolymeshInfo& polyMesh, const Matrix4x4& transform) {

  // Build halfedge mesh from polygon soup
  vector< vector<size_t> > polygons;
  for (const Collada::Polygon& p : polyMesh.polygons) {
    polygons.push_back(p.vertex_indices);
  }
  vector<Vector3D> vertices = polyMesh.vertices; // DELIBERATE COPY.
  for (int i = 0; i < vertices.size(); i++) {
    vertices[i] = (transform * Vector4D(vertices[i], 1)).projectTo3D();
  }

  // Read texture coordinates.
  vector<Vector2D> texcoords = polyMesh.texcoords; // DELIBERATE COPY.

  mesh.build(polygons, vertices, texcoords);
  if (polyMesh.material) {
    bsdf = polyMesh.material->bsdf;
  } else {
    bsdf = new DiffuseBSDF(Vector3D(0.5f,0.5f,0.5f));
  }
}